

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall FIX::FieldBase::FieldBase(FieldBase *this,int tag,string *string)

{
  this->_vptr_FieldBase = (_func_int **)&PTR__FieldBase_001fc5f8;
  this->m_tag = tag;
  std::__cxx11::string::string((string *)&this->m_string,(string *)string);
  (this->m_data)._M_dataplus._M_p = (pointer)&(this->m_data).field_2;
  (this->m_data)._M_string_length = 0;
  (this->m_data).field_2._M_local_buf[0] = '\0';
  (this->m_metrics).m_length = 0;
  (this->m_metrics).m_checksum = 0;
  return;
}

Assistant:

FieldBase(int tag, const std::string &string)
      : m_tag(tag),
        m_string(string),
        m_metrics(no_metrics()) {}